

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::global_runtime_dir(Path *__return_storage_ptr__,localpathtype local)

{
  bool bVar1;
  Path run;
  allocator local_89;
  Path local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    std::__cxx11::string::string((string *)&local_28,"/var/local/run",(allocator *)&local_88);
    Path(__return_storage_ptr__,&local_28);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"/run",&local_89);
    Path(&local_88,&local_48);
    std::__cxx11::string::_M_dispose();
    bVar1 = exists(&local_88);
    if (bVar1) {
      Path(__return_storage_ptr__,&local_88);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,"/var/run",&local_89);
      Path(__return_storage_ptr__,&local_68);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_runtime_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/run");

  Path run("/run");
  if (run.exists())
    return run;
  else
    return Path("/var/run");
#elif defined(_WIN32)
  return Path("C:/Temp");
#else
#error Unsupported system.
#endif
}